

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O0

void __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<0>::DynamicIntegerPointsKdTreeEncoder
          (DynamicIntegerPointsKdTreeEncoder<0> *this,uint32_t dimension)

{
  value_type *__value;
  allocator_type *__a;
  uint in_ESI;
  undefined4 *in_RDI;
  DirectBitEncoder *in_stack_fffffffffffffed0;
  allocator_type *in_stack_fffffffffffffed8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  undefined1 *__n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffef0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  undefined1 local_75;
  undefined4 local_74;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_56;
  undefined4 local_30;
  undefined4 local_28;
  undefined4 local_20;
  uint local_c;
  
  *in_RDI = 0;
  in_RDI[2] = in_ESI;
  local_c = in_ESI;
  DirectBitEncoder::DirectBitEncoder(in_stack_fffffffffffffed0);
  DirectBitEncoder::DirectBitEncoder(in_stack_fffffffffffffed0);
  DirectBitEncoder::DirectBitEncoder(in_stack_fffffffffffffed0);
  DirectBitEncoder::DirectBitEncoder(in_stack_fffffffffffffed0);
  local_20 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x29f6ed);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (value_type_conflict5 *)in_stack_fffffffffffffee0,
             (allocator_type *)in_stack_fffffffffffffed8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x29f721);
  local_28 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x29f75d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (value_type_conflict5 *)in_stack_fffffffffffffee0,
             (allocator_type *)in_stack_fffffffffffffed8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x29f788);
  local_30 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x29f7c4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (value_type_conflict5 *)in_stack_fffffffffffffee0,
             (allocator_type *)in_stack_fffffffffffffed8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x29f7ef);
  local_56.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._2_4_ = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x29f835);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (value_type_conflict5 *)in_stack_fffffffffffffee0,
             (allocator_type *)in_stack_fffffffffffffed8);
  this_00 = &local_56;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x29f868);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(this_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x29f893);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffee0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x29f8ad);
  __value = (value_type *)(ulong)local_c;
  __a = (allocator_type *)(ulong)(local_c * 0x20 + 1);
  local_74 = 0;
  __n = &local_75;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x29f8f3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(size_type)__n,
             (value_type_conflict5 *)__value,__a);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x29f925);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(this_00,(size_type)__n,__value,(allocator_type *)__a);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x29f94f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(__value);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x29f969);
  return;
}

Assistant:

explicit DynamicIntegerPointsKdTreeEncoder(uint32_t dimension)
      : bit_length_(0),
        dimension_(dimension),
        deviations_(dimension, 0),
        num_remaining_bits_(dimension, 0),
        axes_(dimension, 0),
        base_stack_(32 * dimension + 1, VectorUint32(dimension, 0)),
        levels_stack_(32 * dimension + 1, VectorUint32(dimension, 0)) {}